

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolBuilders.cpp
# Opt level: O0

void __thiscall slang::ast::MethodBuilder::~MethodBuilder(MethodBuilder *this)

{
  ArgList args;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *in_RDI;
  pointer ppFVar3;
  __extent_storage<18446744073709551615UL> _Var4;
  
  bVar1 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::empty
                    ((SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)(in_RDI + 1));
  if (!bVar1) {
    ppFVar3 = (pointer)(in_RDI->_M_extent)._M_extent_value;
    iVar2 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                      ((SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)(in_RDI + 1),
                       (EVP_PKEY_CTX *)in_RDI->_M_ptr,src);
    _Var4._M_extent_value = extraout_RDX;
    std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
    span<const_slang::ast::FormalArgumentSymbol_*,_18446744073709551615UL>
              (in_RDI,(span<const_slang::ast::FormalArgumentSymbol_*,_18446744073709551615UL> *)
                      CONCAT44(extraout_var,iVar2));
    args._M_extent._M_extent_value = _Var4._M_extent_value;
    args._M_ptr = ppFVar3;
    SubroutineSymbol::setArguments((SubroutineSymbol *)0x46879b,args);
  }
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x4687ad);
  return;
}

Assistant:

MethodBuilder::~MethodBuilder() {
    if (!args.empty())
        symbol.setArguments(args.copy(compilation));
}